

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

double nk_strtod(char *str,char **endptr)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x1907,"double nk_strtod(const char *, const char **)");
  }
  for (; *str == ' '; str = str + 1) {
  }
  if (*str == '-') {
    str = str + 1;
    dVar6 = -1.0;
  }
  else {
    dVar6 = 1.0;
  }
  dVar7 = 0.0;
  while( true ) {
    cVar4 = *str;
    if ((cVar4 == '\0') || (cVar4 == 'e')) goto LAB_0011ae04;
    if (cVar4 == '.') break;
    dVar7 = dVar7 * 10.0 + (double)(cVar4 + -0x30);
    str = str + 1;
  }
  dVar8 = 0.1;
  while( true ) {
    str = str + 1;
    cVar4 = *str;
    if ((cVar4 == '\0') || (cVar4 == 'e')) break;
    dVar7 = dVar7 + (double)(cVar4 + -0x30) * dVar8;
    dVar8 = dVar8 * 0.1;
  }
LAB_0011ae04:
  if (*str == 'e') {
    bVar5 = (str[1] - 0x2bU & 0xfd) == 0;
    pcVar2 = str + 1;
    if (bVar5) {
      pcVar2 = str + 2;
    }
    iVar3 = 0;
    cVar4 = str[(ulong)bVar5 + 1];
    while (cVar4 != '\0') {
      iVar3 = (int)cVar4 + iVar3 * 10 + -0x30;
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
      cVar4 = *pcVar1;
    }
    dVar8 = 1.0;
    if (0 < iVar3) {
      do {
        dVar8 = dVar8 * 10.0;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    if (str[1] == '-') {
      dVar7 = dVar7 / dVar8;
      str = pcVar2;
    }
    else {
      dVar7 = dVar7 * dVar8;
      str = pcVar2;
    }
  }
  if (endptr != (char **)0x0) {
    *endptr = str;
  }
  return dVar6 * dVar7;
}

Assistant:

NK_API double
nk_strtod(const char *str, const char **endptr)
{
    double m;
    double neg = 1.0;
    const char *p = str;
    double value = 0;
    double number = 0;

    NK_ASSERT(str);
    if (!str) return 0;

    /* skip whitespace */
    while (*p == ' ') p++;
    if (*p == '-') {
        neg = -1.0;
        p++;
    }

    while (*p && *p != '.' && *p != 'e') {
        value = value * 10.0 + (double) (*p - '0');
        p++;
    }

    if (*p == '.') {
        p++;
        for(m = 0.1; *p && *p != 'e'; p++ ) {
            value = value + (double) (*p - '0') * m;
            m *= 0.1;
        }
    }
    if (*p == 'e') {
        int i, pow, div;
        p++;
        if (*p == '-') {
            div = nk_true;
            p++;
        } else if (*p == '+') {
            div = nk_false;
            p++;
        } else div = nk_false;

        for (pow = 0; *p; p++)
            pow = pow * 10 + (int) (*p - '0');

        for (m = 1.0, i = 0; i < pow; i++)
            m *= 10.0;

        if (div)
            value /= m;
        else value *= m;
    }
    number = value * neg;
    if (endptr)
        *endptr = p;
    return number;
}